

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool duckdb::SubtractPropagateStatistics::Operation<short,duckdb::TrySubtractOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  short left;
  short right;
  int64_t unaff_retaddr;
  LogicalType *in_stack_00000008;
  short max;
  short min;
  Value *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int16_t in_stack_ffffffffffffff44;
  BaseStatistics *in_stack_ffffffffffffff90;
  undefined1 local_1;
  
  left = NumericStats::GetMin<short>(in_stack_ffffffffffffff90);
  NumericStats::GetMax<short>(in_stack_ffffffffffffff90);
  bVar1 = TrySubtractOperator::Operation<short,short,short>
                    (left,in_stack_ffffffffffffff44,(int16_t *)in_stack_ffffffffffffff38);
  if (bVar1) {
    right = NumericStats::GetMax<short>(in_stack_ffffffffffffff90);
    NumericStats::GetMin<short>(in_stack_ffffffffffffff90);
    bVar1 = TrySubtractOperator::Operation<short,short,short>
                      (left,right,(int16_t *)in_stack_ffffffffffffff38);
    if (bVar1) {
      Value::Numeric(in_stack_00000008,unaff_retaddr);
      Value::operator=((Value *)CONCAT26(left,CONCAT24(right,in_stack_ffffffffffffff40)),
                       in_stack_ffffffffffffff38);
      Value::~Value((Value *)CONCAT26(left,CONCAT24(right,in_stack_ffffffffffffff40)));
      Value::Numeric(in_stack_00000008,unaff_retaddr);
      Value::operator=((Value *)CONCAT26(left,CONCAT24(right,in_stack_ffffffffffffff40)),
                       in_stack_ffffffffffffff38);
      Value::~Value((Value *)CONCAT26(left,CONCAT24(right,in_stack_ffffffffffffff40)));
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(rstats), min)) {
			return true;
		}
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMin<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}